

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O0

void __thiscall JumpBasic::analyzeGuards(JumpBasic *this,BlockBasic *bl,int4 pathout)

{
  BlockBasic *pBVar1;
  bool bVar2;
  int4 iVar3;
  int4 iVar4;
  OpCode OVar5;
  PcodeOp *this_00;
  PcodeOp *op;
  int4 local_124;
  GuardRecord local_118;
  Varnode *local_d0;
  Varnode *markup;
  int4 local_7c;
  undefined1 local_78 [4];
  int4 indpathstore;
  CircleRange rng;
  bool toswitchval;
  PcodeOp *cbranch;
  Varnode *vn;
  BlockBasic *prevbl;
  bool usenzmask;
  int4 maxpullback;
  int4 maxbranch;
  int4 indpath;
  int4 j;
  int4 i;
  int4 pathout_local;
  BlockBasic *bl_local;
  JumpBasic *this_local;
  
  iVar3 = JumpTable::getStage((this->super_JumpModel).jumptable);
  std::vector<GuardRecord,_std::allocator<GuardRecord>_>::clear(&this->selectguards);
  indpath = 0;
  j = pathout;
  _i = bl;
  do {
    if (1 < indpath) {
      return;
    }
    pBVar1 = _i;
    if ((j < 0) || (iVar4 = FlowBlock::sizeOut(&_i->super_FlowBlock), iVar4 != 2)) {
      do {
        _i = pBVar1;
        iVar4 = FlowBlock::sizeIn(&_i->super_FlowBlock);
        if (iVar4 != 1) {
          return;
        }
        vn = (Varnode *)FlowBlock::getIn(&_i->super_FlowBlock,0);
        iVar4 = FlowBlock::sizeOut((FlowBlock *)vn);
        pBVar1 = (BlockBasic *)vn;
      } while (iVar4 == 1);
      maxpullback = FlowBlock::getInRevIndex(&_i->super_FlowBlock,0);
    }
    else {
      vn = (Varnode *)_i;
      FlowBlock::getOut(&_i->super_FlowBlock,j);
      maxpullback = j;
    }
    j = -1;
    this_00 = (PcodeOp *)(**(code **)(*(long *)vn + 0x70))();
    if (this_00 == (PcodeOp *)0x0) {
      return;
    }
    OVar5 = PcodeOp::code(this_00);
    if (OVar5 != CPUI_CBRANCH) {
      return;
    }
    rng.step._3_1_ = maxpullback == 1;
    bVar2 = PcodeOp::isBooleanFlip(this_00);
    if (bVar2) {
      rng.step._3_1_ = (rng.step._3_1_ ^ 0xff) & 1;
    }
    _i = (BlockBasic *)vn;
    cbranch = (PcodeOp *)PcodeOp::getIn(this_00,1);
    CircleRange::CircleRange((CircleRange *)local_78,(bool)(rng.step._3_1_ & 1));
    bVar2 = FlowBlock::getFlipPath((FlowBlock *)vn);
    if (bVar2) {
      local_124 = 1 - maxpullback;
    }
    else {
      local_124 = maxpullback;
    }
    local_7c = local_124;
    GuardRecord::GuardRecord
              ((GuardRecord *)&markup,this_00,local_124,(CircleRange *)local_78,(Varnode *)cbranch);
    std::vector<GuardRecord,_std::allocator<GuardRecord>_>::push_back
              (&this->selectguards,(value_type *)&markup);
    maxbranch = 0;
    while ((maxbranch < 2 && (bVar2 = Varnode::isWritten((Varnode *)cbranch), bVar2))) {
      op = Varnode::getDef((Varnode *)cbranch);
      cbranch = (PcodeOp *)CircleRange::pullBack((CircleRange *)local_78,op,&local_d0,iVar3 == 0);
      if (((Varnode *)cbranch == (Varnode *)0x0) ||
         (bVar2 = CircleRange::isEmpty((CircleRange *)local_78), bVar2)) break;
      GuardRecord::GuardRecord
                (&local_118,this_00,local_7c,(CircleRange *)local_78,(Varnode *)cbranch);
      std::vector<GuardRecord,_std::allocator<GuardRecord>_>::push_back
                (&this->selectguards,&local_118);
      maxbranch = maxbranch + 1;
    }
    indpath = indpath + 1;
  } while( true );
}

Assistant:

void JumpBasic::analyzeGuards(BlockBasic *bl,int4 pathout)

{ // Analyze each CBRANCH leading up to -bl- switch.
  // (if pathout>=0, also analyze the CBRANCH in -bl- that chooses this path)
  // Analyze the range restrictions on the various variables which allow
  // control flow to pass through the CBRANCHs to the switch.
  // Make note of all these restrictions in the guard list
  // For later determination of the correct switch variable.
  int4 i,j,indpath;
  int4 maxbranch = 2;		// Maximum number of CBRANCHs to consider
  int4 maxpullback = 2;
  bool usenzmask = (jumptable->getStage() == 0);

  selectguards.clear();
  BlockBasic *prevbl;
  Varnode *vn;

  for(i=0;i<maxbranch;++i) {
    if ((pathout>=0)&&(bl->sizeOut()==2)) {
      prevbl = bl;
      bl = (BlockBasic *)prevbl->getOut(pathout);
      indpath = pathout;
      pathout = -1;
    }
    else {
      pathout = -1;		// Make sure not to use pathout next time around
      for(;;) {
	if (bl->sizeIn() != 1) return; // Assume only 1 path to switch
	prevbl = (BlockBasic *)bl->getIn(0);
	if (prevbl->sizeOut() != 1) break; // Is it possible to deviate from switch path in this block
	bl = prevbl;		// If not, back up to next block
      }
      indpath = bl->getInRevIndex(0);
    }
    PcodeOp *cbranch = prevbl->lastOp();
    if ((cbranch==(PcodeOp *)0)||(cbranch->code() != CPUI_CBRANCH))
      break;
    bool toswitchval = (indpath == 1);
    if (cbranch->isBooleanFlip())
      toswitchval = !toswitchval;
    bl = prevbl;
    vn = cbranch->getIn(1);
    CircleRange rng(toswitchval);
    
    // The boolean variable could conceivably be the switch variable
    int4 indpathstore = prevbl->getFlipPath() ? 1-indpath : indpath;
    selectguards.push_back(GuardRecord(cbranch,indpathstore,rng,vn));
    for(j=0;j<maxpullback;++j) {
      Varnode *markup;		// Throw away markup information
      if (!vn->isWritten()) break;
      vn = rng.pullBack(vn->getDef(),&markup,usenzmask);
      if (vn == (Varnode *)0) break;
      if (rng.isEmpty()) break;
      selectguards.push_back(GuardRecord(cbranch,indpathstore,rng,vn));
    }
  }
}